

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevent_fork.h
# Opt level: O2

void snmalloc::PreventFork::postfork_parent(void)

{
  long *plVar1;
  long in_FS_OFFSET;
  
  plVar1 = (long *)(in_FS_OFFSET + -0x10);
  *plVar1 = *plVar1 + -1;
  if (*plVar1 != 0) {
    return;
  }
  *(long *)(in_FS_OFFSET + -0x18) = *(long *)(in_FS_OFFSET + -0x18) + -1;
  LOCK();
  threads_preventing_fork.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)
       ((long)threads_preventing_fork.super___atomic_base<unsigned_long>._M_i + -1);
  UNLOCK();
  return;
}

Assistant:

static void postfork_parent()
    {
      // Count out the number of handlers that have been called, and
      // only perform on the last.
      if (--depth_of_handlers != 0)
        return;

      // This thread is no longer preventing a fork, so decrement the counter.
      depth_of_prevention--;

      // Allow other threads to allocate
      // Just remove the bit, and let the potential other threads in prefork
      // remove their counts.
      threads_preventing_fork--;
    }